

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O1

void test_97(QPDF *pdf,char *arg2)

{
  char cVar1;
  int iVar2;
  QPDFObjectHandle nulls2;
  QPDFObjectHandle nulls;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  long *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  long local_50 [2];
  undefined1 local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  long *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  long local_20 [2];
  
  QPDF::getTrailer();
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"/Nulls","");
  QPDFObjectHandle::getKey((string *)&local_30);
  QPDFObjectHandle::getArrayItem((int)local_40);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  cVar1 = QPDFObjectHandle::isArray();
  if (cVar1 != '\0') {
    iVar2 = QPDFObjectHandle::getArrayNItems();
    if (10000 < iVar2) {
      QPDFObjectHandle::shallowCopy();
      QPDFObjectHandle::unparse_abi_cxx11_();
      QPDFObjectHandle::unparse_abi_cxx11_();
      if (local_58 == local_28) {
        if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          iVar2 = bcmp(local_60,local_30,(size_t)local_58);
          if (iVar2 != 0) goto LAB_001402bc;
        }
        if (local_30 != local_20) {
          operator_delete(local_30,local_20[0] + 1);
        }
        if (local_60 != local_50) {
          operator_delete(local_60,local_50[0] + 1);
        }
        if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
        }
        if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
        }
        return;
      }
LAB_001402bc:
      __assert_fail("nulls.unparse() == nulls2.unparse()",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0xd70,"void test_97(QPDF &, const char *)");
    }
  }
  __assert_fail("nulls.isArray() && nulls.getArrayNItems() > 10000",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc",
                0xd6e,"void test_97(QPDF &, const char *)");
}

Assistant:

static void
test_97(QPDF& pdf, char const* arg2)
{
    // Shallow array copy. This test uses many-nulls.pdf.
    auto nulls = pdf.getTrailer().getKey("/Nulls").getArrayItem(0);
    assert(nulls.isArray() && nulls.getArrayNItems() > 10000);
    auto nulls2 = nulls.shallowCopy();
    assert(nulls.unparse() == nulls2.unparse());
}